

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O1

_Bool MOS65XX_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *inst_info)

{
  uint8_t *puVar1;
  byte bVar2;
  _Bool _Var3;
  mos65xx_insn mVar4;
  mos65xx_address_mode mVar5;
  cs_detail *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong Val;
  mos65xx_reg mVar9;
  mos65xx_address_mode am;
  
  if (code_len == 0) {
    *size = 1;
    return false;
  }
  bVar2 = *code;
  mVar4 = OpInfoTable[bVar2].ins;
  uVar8 = (ulong)mVar4;
  if (uVar8 == 0) {
LAB_001d8577:
    *size = 1;
    return false;
  }
  mVar5 = OpInfoTable[bVar2].am;
  uVar7 = 1;
  if (mVar5 - MOS65XX_AM_ABS < 0xb) {
    uVar7 = *(uint *)(&DAT_003679c8 + (ulong)(mVar5 - MOS65XX_AM_ABS) * 4);
  }
  if (code_len < uVar7) goto LAB_001d8577;
  MI->address = address;
  MI->Opcode = (uint)bVar2;
  MI->OpcodePub = mVar4;
  MI->size = '\0';
  *size = (uint16_t)uVar7;
  if (uVar7 == 3) {
    Val = (ulong)*(ushort *)(code + 1);
LAB_001d85b7:
    MCOperand_CreateImm0(MI,Val);
  }
  else if (uVar7 == 2) {
    Val = (ulong)code[1];
    goto LAB_001d85b7;
  }
  pcVar6 = MI->flat_insn->detail;
  if (pcVar6 == (cs_detail *)0x0) {
    return true;
  }
  (pcVar6->field_6).arm64.cc = mVar5;
  _Var3 = InstructionInfoTable[uVar8].modifies_status;
  (pcVar6->field_6).x86.opcode[0] = _Var3;
  pcVar6->groups_count = '\0';
  pcVar6->regs_read_count = '\0';
  pcVar6->regs_write_count = '\0';
  (pcVar6->field_6).x86.opcode[1] = '\0';
  if (InstructionInfoTable[uVar8].group_type != MOS65XX_GRP_INVALID) {
    pcVar6->groups[0] = (uint8_t)InstructionInfoTable[uVar8].group_type;
    pcVar6->groups_count = '\x01';
  }
  mVar9 = InstructionInfoTable[uVar8].read;
  if (mVar9 == MOS65XX_REG_INVALID) {
    uVar7 = mVar5 - MOS65XX_AM_ACC;
    if ((uVar7 < 10) && ((0x3f1U >> (uVar7 & 0x1f) & 1) != 0)) {
      mVar9 = (mos65xx_reg)*(ushort *)(&DAT_003679f4 + (ulong)uVar7 * 2);
      goto LAB_001d8615;
    }
  }
  else {
LAB_001d8615:
    pcVar6->regs_read_count = '\x01';
    pcVar6->regs_read[0] = (uint16_t)mVar9;
  }
  mVar9 = InstructionInfoTable[uVar8].write;
  if ((mVar9 != MOS65XX_REG_INVALID) || (mVar9 = MOS65XX_REG_ACC, mVar5 == MOS65XX_AM_ACC)) {
    pcVar6->regs_write_count = '\x01';
    pcVar6->regs_write[0] = (uint16_t)mVar9;
  }
  if (_Var3 != false) {
    bVar2 = pcVar6->regs_write_count;
    pcVar6->regs_write_count = bVar2 + 1;
    pcVar6->regs_write[bVar2] = 4;
  }
  if ((int)mVar5 < 5) {
    if (mVar5 == MOS65XX_AM_IMP) {
      return true;
    }
    if (mVar5 == MOS65XX_AM_ACC) {
      uVar8 = (ulong)(pcVar6->field_6).x86.opcode[1];
      puVar1 = pcVar6->groups + uVar8 * 8 + 0x15;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\x01';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      goto LAB_001d86d0;
    }
LAB_001d86bb:
    uVar8 = (ulong)(pcVar6->field_6).x86.opcode[1];
    puVar1 = pcVar6->groups + uVar8 * 8 + 0x15;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
  }
  else {
    if (mVar5 == MOS65XX_AM_REL) {
      return true;
    }
    if (mVar5 != MOS65XX_AM_IMM) goto LAB_001d86bb;
    uVar8 = (ulong)(pcVar6->field_6).x86.opcode[1];
    puVar1 = pcVar6->groups + uVar8 * 8 + 0x15;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
  }
  *(undefined2 *)(pcVar6->groups + uVar8 * 8 + 0x19) = *(undefined2 *)&MI->Operands[0].field_2;
LAB_001d86d0:
  (pcVar6->field_6).x86.opcode[1] = (char)uVar8 + '\x01';
  return true;
}

Assistant:

bool MOS65XX_getInstruction(csh ud, const uint8_t *code, size_t code_len,
							MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned char opcode;
	unsigned char len;
	mos65xx_insn ins;

	if (code_len == 0) {
		*size = 1;
		return false;
	}

	opcode = code[0];
	ins = OpInfoTable[opcode].ins;
	if (ins == MOS65XX_INS_INVALID) {
		*size = 1;
		return false;
	}

	len = getInstructionLength(OpInfoTable[opcode].am);
	if (code_len < len) {
		*size = 1;
		return false;
	}

	MI->address = address;
	MI->Opcode = opcode;
	MI->OpcodePub = ins;
	MI->size = 0;

	*size = len;
	if (len == 2) {
		MCOperand_CreateImm0(MI, code[1]);
	} else
	if (len == 3) {
		MCOperand_CreateImm0(MI, (code[2]<<8) | code[1]);
	}
#ifndef CAPSTONE_DIET
	if (MI->flat_insn->detail) {
		fillDetails(MI, opcode);
	}
#endif

	return true;
}